

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

optional<wallet::SelectionResult> *
wallet::coinselector_tests::KnapsackSolver
          (optional<wallet::SelectionResult> *__return_storage_ptr__,
          vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *groups,
          CAmount *nTargetValue,CAmount change_target,FastRandomContext *rng)

{
  T *pTVar1;
  long in_FS_OFFSET;
  Result<wallet::SelectionResult> res;
  _Variant_storage<false,_bilingual_str,_wallet::SelectionResult> local_90;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  wallet::KnapsackSolver
            ((Result<wallet::SelectionResult> *)&local_90,groups,nTargetValue,change_target,rng,
             400000);
  if (local_90._M_index == '\x01') {
    pTVar1 = util::Result<wallet::SelectionResult>::value
                       ((Result<wallet::SelectionResult> *)&local_90);
    std::_Optional_payload_base<wallet::SelectionResult>::
    _Optional_payload_base<wallet::SelectionResult&>
              ((_Optional_payload_base<wallet::SelectionResult> *)__return_storage_ptr__,pTVar1);
  }
  else {
    (__return_storage_ptr__->super__Optional_base<wallet::SelectionResult,_false,_false>)._M_payload
    .super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
  }
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
  ~_Variant_storage(&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<SelectionResult> KnapsackSolver(std::vector<OutputGroup>& groups, const CAmount& nTargetValue,
                                              CAmount change_target, FastRandomContext& rng)
{
    auto res{KnapsackSolver(groups, nTargetValue, change_target, rng, MAX_STANDARD_TX_WEIGHT)};
    return res ? std::optional<SelectionResult>(*res) : std::nullopt;
}